

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O1

void __thiscall glcts::GeometryShaderRenderingCase::deinit(GeometryShaderRenderingCase *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo_id);
    this->m_fbo_id = 0;
  }
  if (this->m_fs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_fs_id = 0;
  }
  if (this->m_gs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_gs_id = 0;
  }
  if (this->m_instanced_fbo_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_instanced_fbo_id);
    this->m_instanced_fbo_id = 0;
  }
  if (this->m_instanced_read_fbo_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_instanced_read_fbo_id);
    this->m_instanced_read_fbo_id = 0;
  }
  if (this->m_instanced_to_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_instanced_to_id);
    this->m_instanced_to_id = 0;
  }
  if (this->m_po_id != 0) {
    (**(code **)(lVar2 + 0x448))();
    this->m_po_id = 0;
  }
  if (this->m_instanced_raw_arrays_bo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_instanced_raw_arrays_bo_id);
    this->m_instanced_raw_arrays_bo_id = 0;
  }
  if (this->m_instanced_unordered_arrays_bo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_instanced_unordered_arrays_bo_id);
    this->m_instanced_unordered_arrays_bo_id = 0;
  }
  if (this->m_instanced_unordered_elements_bo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_instanced_unordered_elements_bo_id);
    this->m_instanced_unordered_elements_bo_id = 0;
  }
  if (this->m_noninstanced_raw_arrays_bo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_noninstanced_raw_arrays_bo_id);
    this->m_noninstanced_raw_arrays_bo_id = 0;
  }
  if (this->m_noninstanced_unordered_arrays_bo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_noninstanced_unordered_arrays_bo_id);
    this->m_noninstanced_unordered_arrays_bo_id = 0;
  }
  if (this->m_noninstanced_unordered_elements_bo_id != 0) {
    (**(code **)(lVar2 + 0x438))(1,&this->m_noninstanced_unordered_elements_bo_id);
    this->m_noninstanced_unordered_elements_bo_id = 0;
  }
  if (this->m_read_fbo_id != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_read_fbo_id);
    this->m_read_fbo_id = 0;
  }
  if (this->m_to_id != 0) {
    (**(code **)(lVar2 + 0x480))(1,&this->m_to_id);
    this->m_to_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar2 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar2 + 0x470))();
    this->m_vs_id = 0;
  }
  return;
}

Assistant:

void GeometryShaderRenderingCase::deinit()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);

		m_fbo_id = 0;
	}

	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);

		m_fs_id = 0;
	}

	if (m_gs_id != 0)
	{
		gl.deleteShader(m_gs_id);

		m_gs_id = 0;
	}

	if (m_instanced_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_instanced_fbo_id);

		m_instanced_fbo_id = 0;
	}

	if (m_instanced_read_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_instanced_read_fbo_id);

		m_instanced_read_fbo_id = 0;
	}

	if (m_instanced_to_id != 0)
	{
		gl.deleteTextures(1, &m_instanced_to_id);

		m_instanced_to_id = 0;
	}

	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);

		m_po_id = 0;
	}

	if (m_instanced_raw_arrays_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_instanced_raw_arrays_bo_id);

		m_instanced_raw_arrays_bo_id = 0;
	}

	if (m_instanced_unordered_arrays_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_instanced_unordered_arrays_bo_id);

		m_instanced_unordered_arrays_bo_id = 0;
	}

	if (m_instanced_unordered_elements_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_instanced_unordered_elements_bo_id);

		m_instanced_unordered_elements_bo_id = 0;
	}

	if (m_noninstanced_raw_arrays_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_noninstanced_raw_arrays_bo_id);

		m_noninstanced_raw_arrays_bo_id = 0;
	}

	if (m_noninstanced_unordered_arrays_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_noninstanced_unordered_arrays_bo_id);

		m_noninstanced_unordered_arrays_bo_id = 0;
	}

	if (m_noninstanced_unordered_elements_bo_id != 0)
	{
		gl.deleteBuffers(1, &m_noninstanced_unordered_elements_bo_id);

		m_noninstanced_unordered_elements_bo_id = 0;
	}

	if (m_read_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_read_fbo_id);

		m_read_fbo_id = 0;
	}

	if (m_to_id != 0)
	{
		gl.deleteTextures(1, &m_to_id);

		m_to_id = 0;
	}

	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);

		m_vao_id = 0;
	}

	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);

		m_vs_id = 0;
	}
}